

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::list_caster<std::vector<double,_std::allocator<double>_>,_double>::load
          (list_caster<std::vector<double,_std::allocator<double>_>,_double> *this,handle src,
          bool convert)

{
  bool bVar1;
  template_cast_op_type<typename_std::add_rvalue_reference<double_&&>::type> __x;
  sequence_iterator sVar2;
  sequence_slow_readwrite sVar3;
  handle local_c8;
  PyObject *local_c0;
  type_caster<double,_void> local_b8;
  value_conv conv;
  reference it;
  sequence_iterator __end3;
  sequence_iterator __begin3;
  sequence *__range3;
  sequence local_58;
  PyObject *local_50;
  sequence local_48;
  sequence s;
  bool convert_local;
  list_caster<std::vector<double,_std::allocator<double>_>,_double> *this_local;
  handle src_local;
  
  bVar1 = isinstance<pybind11::sequence,_0>(src);
  if (((!bVar1) || (bVar1 = isinstance<pybind11::bytes,_0>(src), bVar1)) ||
     (s.super_object.super_handle.m_ptr = (object)(object)src.m_ptr,
     bVar1 = isinstance<pybind11::str,_0>(src), bVar1)) {
    src_local.m_ptr._7_1_ = 0;
  }
  else {
    local_50 = src.m_ptr;
    reinterpret_borrow<pybind11::sequence>((pybind11 *)&local_48,src);
    std::vector<double,_std::allocator<double>_>::clear(&this->value);
    sequence::sequence(&local_58,&local_48);
    reserve_maybe<std::vector<double,_std::allocator<double>_>,_0>(this,&local_58,&this->value);
    sequence::~sequence(&local_58);
    sVar2 = sequence::begin(&local_48);
    __end3.super_sequence_slow_readwrite.index =
         (ssize_t)sVar2.super_sequence_slow_readwrite.obj.m_ptr;
    sVar3 = (sequence_slow_readwrite)sequence::end(&local_48);
    while( true ) {
      __end3.super_sequence_slow_readwrite.obj.m_ptr = (PyObject *)sVar3.index;
      it.cache.super_handle.m_ptr = sVar3.obj.m_ptr;
      bVar1 = detail::operator!=((It *)&__end3.super_sequence_slow_readwrite.index,(It *)&it.cache);
      if (!bVar1) break;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator*
                ((reference *)&conv,
                 (generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 &__end3.super_sequence_slow_readwrite.index);
      accessor::operator_cast_to_object((accessor *)&local_c8);
      local_c0 = local_c8.m_ptr;
      bVar1 = type_caster<double,_void>::load(&local_b8,local_c8,convert);
      object::~object((object *)&local_c8);
      bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
      if (bVar1) {
        src_local.m_ptr._7_1_ = 0;
      }
      else {
        __x = cast_op<double&&>(&local_b8);
        std::vector<double,_std::allocator<double>_>::push_back(&this->value,__x);
      }
      accessor<pybind11::detail::accessor_policies::sequence_item>::~accessor
                ((accessor<pybind11::detail::accessor_policies::sequence_item> *)&conv);
      if (bVar1) goto LAB_00140b67;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator++
                ((generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 &__end3.super_sequence_slow_readwrite.index);
      sVar3.index = (ssize_t)__end3.super_sequence_slow_readwrite.obj.m_ptr;
      sVar3.obj = it.cache.super_handle.m_ptr;
    }
    src_local.m_ptr._7_1_ = 1;
LAB_00140b67:
    sequence::~sequence(&local_48);
  }
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<bytes>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }